

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O2

PyObject *
boost::python::objects::
class_cref_wrapper<StimulationCommand,_boost::python::objects::make_instance<StimulationCommand,_boost::python::objects::value_holder<StimulationCommand>_>_>
::convert(StimulationCommand *x)

{
  PyObject *pPVar1;
  reference_wrapper<const_StimulationCommand> local_8;
  
  local_8.t_ = x;
  pPVar1 = make_instance_impl<StimulationCommand,boost::python::objects::value_holder<StimulationCommand>,boost::python::objects::make_instance<StimulationCommand,boost::python::objects::value_holder<StimulationCommand>>>
           ::execute<boost::reference_wrapper<StimulationCommand_const>const>(&local_8);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }